

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

void __thiscall
xemmai::t_parser::t_error::t_error
          (t_error *this,wstring_view a_message,wstring_view a_path,t_at *a_at)

{
  size_t sVar1;
  wstring_view a_message_00;
  allocator<wchar_t> local_71;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_70;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_50;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_40;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_20;
  
  local_50._M_str = a_path._M_str;
  local_50._M_len = a_path._M_len;
  local_20._M_str = a_message._M_str;
  local_20._M_len = a_message._M_len;
  std::__cxx11::wstring::wstring<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
            ((wstring *)&local_40,&local_20,&local_71);
  std::operator+(&local_70,L"syntax error: ",&local_40);
  a_message_00._M_str = local_70._M_dataplus._M_p;
  a_message_00._M_len = local_70._M_string_length;
  t_throwable::t_throwable(&this->super_t_throwable,a_message_00);
  std::__cxx11::wstring::~wstring((wstring *)&local_70);
  std::__cxx11::wstring::~wstring((wstring *)&local_40);
  (this->super_t_throwable)._vptr_t_throwable = (_func_int **)&PTR__t_error_001ad9e0;
  std::__cxx11::wstring::wstring<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
            ((wstring *)&this->v_path,&local_50,(allocator<wchar_t> *)&local_70);
  (this->v_at).v_column = a_at->v_column;
  sVar1 = a_at->v_line;
  (this->v_at).v_position = a_at->v_position;
  (this->v_at).v_line = sVar1;
  return;
}

Assistant:

t_error(std::wstring_view a_message, std::wstring_view a_path, const t_at& a_at) : t_throwable(L"syntax error: " + std::wstring(a_message)), v_path(a_path), v_at(a_at)
		{
		}